

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O2

void __thiscall
OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>::add
          (Accumulator<std::vector<double,_std::allocator<double>_>_> *this,
          vector<double,_std::allocator<double>_> *val)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  size_t sVar8;
  size_t i;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  
  pdVar4 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 != pdVar7) {
    pdVar5 = (this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((pdVar6 == pdVar5) || ((long)pdVar7 - (long)pdVar4 == (long)pdVar6 - (long)pdVar5))
    goto LAB_001ef28a;
  }
  memcpy(&painCave,"Size of vector passed to add() did not match the size of the StaticAccumulator."
         ,0x50);
  painCave.isFatal = 1;
  simError();
  pdVar5 = (this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
LAB_001ef28a:
  sVar8 = this->Count_ + 1;
  this->Count_ = sVar8;
  if (pdVar5 == pdVar6) {
    std::vector<double,_std::allocator<double>_>::resize
              (&this->Val_,(long)pdVar7 - (long)pdVar4 >> 3);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->Total_,
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->Avg_,
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->Avg2_,
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    pdVar4 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    sVar8 = this->Count_;
    pdVar5 = (this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  pdVar6 = (this->Val_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->Total_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar11._8_4_ = (int)(sVar8 >> 0x20);
  auVar11._0_8_ = sVar8;
  auVar11._12_4_ = 0x45300000;
  dVar10 = (auVar11._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0);
  pdVar3 = (this->Avg2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar9 = 0; uVar9 < (ulong)((long)pdVar7 - (long)pdVar4 >> 3); uVar9 = uVar9 + 1) {
    dVar1 = pdVar4[uVar9];
    if ((dVar1 != 1.79769313486232e+308) || (NAN(dVar1))) {
      pdVar6[uVar9] = dVar1;
      pdVar2[uVar9] = pdVar4[uVar9] + pdVar2[uVar9];
      pdVar5[uVar9] = (pdVar4[uVar9] - pdVar5[uVar9]) / dVar10 + pdVar5[uVar9];
      dVar1 = pdVar3[uVar9];
      pdVar3[uVar9] = (pdVar4[uVar9] * pdVar4[uVar9] - dVar1) / dVar10 + dVar1;
    }
  }
  return;
}

Assistant:

void add(const std::vector<RealType>& val) {
      if (val.empty() || (val.size() != Avg_.size() && !Avg_.empty())) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Size of vector passed to add() did not "
                 "match the size of the StaticAccumulator.");
        painCave.isFatal = 1;
        simError();
      }

      Count_++;

      if (Avg_.empty()) {
        Val_.resize(val.size());
        Total_.resize(val.size());
        Avg_.resize(val.size());
        Avg2_.resize(val.size());
      }

      for (std::size_t i = 0; i < val.size(); i++) {
        /* If our placeholder, BinEmptyFlag, is passed to add(), we should
            not record data at the current index */
        if (val[i] == BinEmptyFlag) continue;
        Val_[i] = val[i];
        Total_[i] += val[i];
        Avg_[i] += (val[i] - Avg_[i]) / static_cast<RealType>(Count_);
        Avg2_[i] +=
            (val[i] * val[i] - Avg2_[i]) / static_cast<RealType>(Count_);
      }
    }